

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaUtils.cpp
# Opt level: O0

bool nv::cuda::initDevice(int *device_ptr)

{
  int *device_ptr_local;
  
  return false;
}

Assistant:

bool nv::cuda::initDevice(int * device_ptr)
{
	nvDebugCheck(device_ptr != NULL);
#if defined HAVE_CUDA

#if CUDART_VERSION >= 2030 // 2.3

	// Set device flags to yield in order to play nice with other threads and to find out if CUDA was already active.
	cudaError_t resul = cudaSetDeviceFlags(cudaDeviceScheduleYield);

#endif

	int device = getFastestDevice();

	if (device == -1)
	{
		// No device is fast enough.
		*device_ptr = -1;
		return false;
	}

	// Select CUDA device.
	cudaError_t result = cudaSetDevice(device);

	if (result == cudaErrorSetOnActiveProcess)
	{
		int device;
		result = cudaGetDevice(&device);

		*device_ptr = -1;  // No device to cleanup.
		return isValidDevice(device); // Return true if device is valid.
	}
	else if (result != cudaSuccess)
	{
		nvDebug("*** CUDA Error: %s\n", cudaGetErrorString(result));
		*device_ptr = -1;
		return false;
	}

	*device_ptr = device;
	return true;
#else
	return false;
#endif
}